

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::CheckFreeBitVector
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,bool isCollecting)

{
  SmallHeapBlockBitVector *this_00;
  ulong *puVar1;
  ushort uVar2;
  undefined4 *puVar3;
  code *pcVar4;
  anon_class_24_3_3b104623 fn;
  ulong uVar5;
  bool bVar6;
  BOOLEAN BVar7;
  BVIndex BVar8;
  uint uVar9;
  SmallHeapBlockBitVector *pSVar10;
  FreeObject *this_01;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_02;
  ulong uVar11;
  long lVar12;
  undefined7 in_register_00000031;
  uint uVar13;
  undefined8 *in_FS_OFFSET;
  FreeObject *local_160;
  SmallHeapBlockBitVector temp;
  SmallHeapBlockBitVector *local_40;
  SmallHeapBlockBitVector *free;
  uint verifyFreeCount;
  
  if (((int)CONCAT71(in_register_00000031,isCollecting) == 0) &&
     ((*(this->super_HeapBlock)._vptr_HeapBlock[0x10])(this), local_160 != this->freeObjectList)) {
    CheckDebugFreeBitVector(this,false);
    return;
  }
  this_00 = &this->freeBits;
  lVar12 = 0;
  local_40 = this_00;
  memset(&local_160,0,0x100);
  js_memcpy_s(&local_160,0x100,this_00,0x100);
  pSVar10 = GetInvalidBitVector(this);
  do {
    puVar1 = (ulong *)((long)(temp.data + -1) + lVar12);
    *puVar1 = *puVar1 & *(ulong *)((long)&pSVar10->data[0].word + lVar12);
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x100);
  if (local_160 == (FreeObject *)0x0) {
    uVar5 = 0;
    do {
      uVar11 = uVar5;
      if (uVar11 == 0x1f) break;
      uVar5 = uVar11 + 1;
    } while (temp.data[uVar11].word == 0);
    if (uVar11 < 0x1f) goto LAB_0020c5c7;
  }
  else {
LAB_0020c5c7:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x71d,"(temp.IsAllClear())","temp.IsAllClear()");
    if (!bVar6) goto LAB_0020ca09;
    *puVar3 = 0;
  }
  free._4_4_ = 0;
  this_01 = this->freeObjectList;
  if (this_01 != (FreeObject *)0x0) {
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    do {
      if (((ulong)this_01 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                           "HeapInfo::IsAlignedAddress(objectAddress)");
        if (!bVar6) goto LAB_0020ca09;
        *puVar3 = 0;
      }
      uVar13 = (uint)((ulong)this_01 >> 4) & 0x7ff;
      bVar6 = IsValidBitIndex(this,uVar13);
      if (!bVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x724,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
        if (!bVar6) goto LAB_0020ca09;
        *puVar3 = 0;
      }
      BVar7 = BVStatic<2048UL>::Test(&this->debugFreeBits,uVar13);
      if (BVar7 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x725,"(this->GetDebugFreeBitVector()->Test(bitIndex))",
                           "this->GetDebugFreeBitVector()->Test(bitIndex)");
        if (!bVar6) goto LAB_0020ca09;
        *puVar3 = 0;
      }
      BVar7 = BVStatic<2048UL>::Test(local_40,uVar13);
      if (BVar7 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x726,"(free->Test(bitIndex))","free->Test(bitIndex)");
        if (!bVar6) goto LAB_0020ca09;
        *puVar3 = 0;
      }
      free._4_4_ = free._4_4_ + 1;
      this_01 = FreeObject::GetNext(this_01);
    } while (this_01 != (FreeObject *)0x0);
  }
  BVar8 = BVStatic<2048UL>::Count(&this->debugFreeBits);
  if (BVar8 != free._4_4_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x72b,"(this->GetDebugFreeBitVector()->Count() == verifyFreeCount)",
                       "this->GetDebugFreeBitVector()->Count() == verifyFreeCount");
    if (!bVar6) goto LAB_0020ca09;
    *puVar3 = 0;
  }
  uVar2 = this->freeCount;
  BVar8 = BVStatic<2048UL>::Count(this_00);
  if (BVar8 != uVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x72c,"(this->freeCount == this->GetFreeBitVector()->Count())",
                       "this->freeCount == this->GetFreeBitVector()->Count()");
    if (!bVar6) goto LAB_0020ca09;
    *puVar3 = 0;
  }
  uVar13 = (uint)(this->super_HeapBlock).heapBlockType;
  if ((uVar13 < 0xb) && ((0x528U >> (uVar13 & 0x1f) & 1) != 0)) {
    this_02 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock)
    ;
    fn.free = &local_40;
    fn.this = this;
    fn.verifyFreeCount = (uint *)((long)&free + 4);
    temp.data[0x1f].word = (Type)this;
    SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
    ForEachPendingDisposeObject<Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::CheckFreeBitVector(bool)::_lambda(unsigned_int)_1_>
              (this_02,fn);
    uVar9 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
            CheckDisposedObjectFreeBitVector(this_02);
    free._4_4_ = free._4_4_ + uVar9;
  }
  if (free._4_4_ != this->freeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x73f,"(verifyFreeCount == this->freeCount)",
                       "verifyFreeCount == this->freeCount");
    if (!bVar6) goto LAB_0020ca09;
    *puVar3 = 0;
  }
  if (this->lastFreeCount < free._4_4_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x740,"(verifyFreeCount <= this->lastFreeCount)",
                       "verifyFreeCount <= this->lastFreeCount");
    if (!bVar6) goto LAB_0020ca09;
    *puVar3 = 0;
  }
  if (this->freeObjectList != this->lastFreeObjectHead) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x741,"(this->IsFreeBitsValid())","this->IsFreeBitsValid()");
    if (!bVar6) {
LAB_0020ca09:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::CheckFreeBitVector(bool isCollecting)
{
    // during collection, the heap block has the current info when we are verifying
    if (!isCollecting)
    {
        FreeObject * freeObjectList;
        this->GetFreeObjectListOnAllocator(&freeObjectList);
        if (freeObjectList != this->freeObjectList)
        {
            // allocator has the current info and if we have already allocated some memory,
            // the free bit vector isn't really correct, so we can't verify it.
            // Just verify the debug free bit vector
            this->CheckDebugFreeBitVector(false);
            return;
        }
    }

    SmallHeapBlockBitVector * free = this->GetFreeBitVector();

    // Shouldn't be any invalid bits set in the free bit vector
    SmallHeapBlockBitVector temp;
    temp.Copy(free);
    temp.And(this->GetInvalidBitVector());
    Assert(temp.IsAllClear());

    uint verifyFreeCount = 0;
    FreeObject * freeObject = this->freeObjectList;
    while (freeObject != nullptr)
    {
        uint bitIndex = GetAddressBitIndex(freeObject);
        Assert(IsValidBitIndex(bitIndex));
        Assert(this->GetDebugFreeBitVector()->Test(bitIndex));
        Assert(free->Test(bitIndex));
        verifyFreeCount++;

        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == verifyFreeCount);
    Assert(this->freeCount == this->GetFreeBitVector()->Count());

    if (this->IsAnyFinalizableBlock())
    {
        auto finalizableBlock = this->AsFinalizableBlock<TBlockAttributes>();

        // Include pending dispose objects
        finalizableBlock->ForEachPendingDisposeObject([&] (uint index) {
            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            Assert(free->Test(bitIndex));
            verifyFreeCount++;
        });

        // Include disposed objects
        verifyFreeCount += finalizableBlock->CheckDisposedObjectFreeBitVector();
    }

    Assert(verifyFreeCount == this->freeCount);
    Assert(verifyFreeCount <= this->lastFreeCount);
    Assert(this->IsFreeBitsValid());
}